

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::RequestToken
          (CommissionerSafe *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  anon_class_80_4_b999da52 local_98;
  AsyncRequest local_48;
  uint16_t local_22;
  string *psStack_20;
  uint16_t aPort_local;
  string *aAddr_local;
  Handler<ByteArray> *aHandler_local;
  CommissionerSafe *this_local;
  
  local_98.this = this;
  local_22 = aPort;
  psStack_20 = aAddr;
  aAddr_local = (string *)aHandler;
  aHandler_local = (Handler<ByteArray> *)this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function(&local_98.aHandler,aHandler);
  std::__cxx11::string::string((string *)&local_98.aAddr,(string *)psStack_20);
  local_98.aPort = local_22;
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::__0,void>
            ((function<void()> *)&local_48,&local_98);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
  ::$_0::~__0((__0 *)&local_98);
  return;
}

Assistant:

void CommissionerSafe::RequestToken(Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    PushAsyncRequest([=]() { mImpl->RequestToken(aHandler, aAddr, aPort); });
}